

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray
          (CSharedMemoryObjectManager *this,CPalThread *pthr,HANDLE *rghHandlesToReference,
          DWORD dwHandleCount,CAllowedObjectTypes *paot,DWORD dwRightsRequired,IPalObject **rgpobjs)

{
  CPalThread *pCVar1;
  PAL_ERROR PVar2;
  DWORD *pdwRightsGranted;
  DWORD dwRightsGranted_00;
  ulong uVar3;
  bool bVar4;
  DWORD local_54;
  PCRITICAL_SECTION p_Stack_50;
  DWORD dwRightsGranted;
  CAllowedObjectTypes *local_48;
  CPalThread *local_40;
  IPalObject *local_38;
  IPalObject *pobj;
  
  local_38 = (IPalObject *)0x0;
  local_48 = paot;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a3);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (rghHandlesToReference == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a4);
    fprintf(_stderr,"Expression: NULL != rghHandlesToReference\n");
  }
  if (dwHandleCount == 0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a5);
    fprintf(_stderr,"Expression: 0 < dwHandleCount\n");
  }
  if (local_48 == (CAllowedObjectTypes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a6);
    fprintf(_stderr,"Expression: NULL != paot\n");
  }
  local_40 = pthr;
  if (rgpobjs == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a7);
    fprintf(_stderr,"Expression: NULL != rgpobjs\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    p_Stack_50 = &(this->m_HandleManager).m_csLock;
    InternalEnterCriticalSection(local_40,p_Stack_50);
    for (uVar3 = 0; dwHandleCount != uVar3; uVar3 = uVar3 + 1) {
      pdwRightsGranted = &local_54;
      PVar2 = CSimpleHandleManager::GetObjectFromHandle
                        (&this->m_HandleManager,local_40,rghHandlesToReference[uVar3],
                         pdwRightsGranted,&local_38);
      if ((PVar2 != 0) ||
         (PVar2 = CheckObjectTypeAndRights
                            (local_38,local_48,dwRightsGranted_00,(DWORD)pdwRightsGranted),
         PVar2 != 0)) goto LAB_001341b8;
      rgpobjs[uVar3] = local_38;
      local_38 = (IPalObject *)0x0;
    }
    PVar2 = 0;
    uVar3 = (ulong)dwHandleCount;
LAB_001341b8:
    pCVar1 = local_40;
    InternalLeaveCriticalSection(local_40,p_Stack_50);
    if (PVar2 != 0) {
      uVar3 = uVar3 & 0xffffffff;
      while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
        (*rgpobjs[uVar3]->_vptr_IPalObject[8])(rgpobjs[uVar3],pCVar1);
      }
      if (local_38 != (IPalObject *)0x0) {
        (*local_38->_vptr_IPalObject[8])(local_38,pCVar1);
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar2;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray(
    CPalThread *pthr,
    HANDLE rghHandlesToReference[],
    DWORD dwHandleCount,
    CAllowedObjectTypes *paot,
    DWORD dwRightsRequired,
    IPalObject *rgpobjs[]            // OUT (caller allocated)
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobj = NULL;
    DWORD dwRightsGranted;
    DWORD dw;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != rghHandlesToReference);
    _ASSERTE(0 < dwHandleCount);
    _ASSERTE(NULL != paot);
    _ASSERTE(NULL != rgpobjs);

    ENTRY("CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray "
        "(this=%p, pthr=%p, rghHandlesToReference=%p, dwHandleCount=%d, "
        "pAllowedTyped=%d, dwRightsRequired=%d, rgpobjs=%p)\n",
        this,
        pthr,
        rghHandlesToReference,
        dwHandleCount,
        paot,
        dwRightsRequired,
        rgpobjs
        );

    m_HandleManager.Lock(pthr);

    for (dw = 0; dw < dwHandleCount; dw += 1)
    {        
        palError = m_HandleManager.GetObjectFromHandle(
            pthr,
            rghHandlesToReference[dw],
            &dwRightsGranted,
            &pobj
            );

        if (NO_ERROR == palError)
        {
            palError = CheckObjectTypeAndRights(
                pobj,
                paot,
                dwRightsGranted,
                dwRightsRequired
                );

            if (NO_ERROR == palError)
            {
                //
                // Transfer reference to out array
                //

                rgpobjs[dw] = pobj;
                pobj = NULL;
            }
        }

        if (NO_ERROR != palError)
        {
            break;
        }
    }

    //
    // The handle manager lock must be released before releasing
    // any object references, as ReleaseReference will acquire
    // the object manager list lock (which needs to be acquired before
    // the handle manager lock)
    //

    m_HandleManager.Unlock(pthr);

    if (NO_ERROR != palError)
    {
        //
        // dw's current value is the failing index, so we want
        // to free from dw - 1.
        //
        
        while (dw > 0)
        {
            rgpobjs[--dw]->ReleaseReference(pthr);
        }

        if (NULL != pobj)
        {
            pobj->ReleaseReference(pthr);
        }
    }

    LOGEXIT("CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray"
        " returns %d\n",
        palError
        );

    return palError;
}